

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest::ExtractMarkers
          (SourceInfoTest *this,char *text)

{
  char *pcVar1;
  LogMessage *pLVar2;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>_>
  this_00;
  LogMessage local_68;
  Voidify local_53;
  char local_52;
  char local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_40;
  Voidify local_2b;
  char local_2a;
  char local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int column;
  int line;
  char *text_local;
  SourceInfoTest *this_local;
  
  _column = text;
  text_local = (char *)this;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
  ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
           *)&this->markers_);
  std::__cxx11::string::clear();
  absl_log_internal_check_op_result._4_4_ = 0;
  absl_log_internal_check_op_result._0_4_ = 0;
  do {
    if (*_column == '\0') {
      return;
    }
    if (*_column == '$') {
      _column = _column + 1;
      local_29 = absl::lts_20250127::log_internal::GetReferenceableValue('\0');
      local_2a = absl::lts_20250127::log_internal::GetReferenceableValue(*_column);
      local_28 = absl::lts_20250127::log_internal::Check_NEImpl<char,char>
                           (&local_29,&local_2a,"\'\\0\' != *text");
      if (local_28 != (Nullable<const_char_*>)0x0) {
        pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                   ,0xccf,pcVar1);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2b,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      if (*_column == '$') {
        std::__cxx11::string::operator+=((string *)&this->text_without_markers_,'$');
        absl_log_internal_check_op_result._0_4_ = (int)absl_log_internal_check_op_result + 1;
      }
      else {
        absl_log_internal_check_op_result_1 =
             (Nullable<const_char_*>)
             std::make_pair<int&,int&>
                       ((int *)((long)&absl_log_internal_check_op_result + 4),
                        (int *)&absl_log_internal_check_op_result);
        this_00 = absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                  ::
                  operator[]<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                            ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                              *)&this->markers_,_column);
        std::pair<int,_int>::operator=(this_00,(type)&absl_log_internal_check_op_result_1);
        _column = _column + 1;
        local_51 = absl::lts_20250127::log_internal::GetReferenceableValue('$');
        local_52 = absl::lts_20250127::log_internal::GetReferenceableValue(*_column);
        local_50 = absl::lts_20250127::log_internal::Check_EQImpl<char,char>
                             (&local_51,&local_52,"\'$\' == *text");
        if (local_50 != (Nullable<const_char_*>)0x0) {
          pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                     ,0xcd6,pcVar1);
          pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_53,pLVar2);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_68);
        }
        local_50 = (Nullable<const_char_*>)0x0;
      }
    }
    else if (*_column == '\n') {
      absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ + 1;
      absl_log_internal_check_op_result._0_4_ = 0;
      std::__cxx11::string::operator+=((string *)&this->text_without_markers_,*_column);
    }
    else {
      std::__cxx11::string::operator+=((string *)&this->text_without_markers_,*_column);
      absl_log_internal_check_op_result._0_4_ = (int)absl_log_internal_check_op_result + 1;
    }
    _column = _column + 1;
  } while( true );
}

Assistant:

void ExtractMarkers(const char* text) {
    markers_.clear();
    text_without_markers_.clear();
    int line = 0;
    int column = 0;
    while (*text != '\0') {
      if (*text == '$') {
        ++text;
        ABSL_CHECK_NE('\0', *text);
        if (*text == '$') {
          text_without_markers_ += '$';
          ++column;
        } else {
          markers_[*text] = std::make_pair(line, column);
          ++text;
          ABSL_CHECK_EQ('$', *text);
        }
      } else if (*text == '\n') {
        ++line;
        column = 0;
        text_without_markers_ += *text;
      } else {
        text_without_markers_ += *text;
        ++column;
      }
      ++text;
    }
  }